

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *pDVar2;
  string field_name;
  string field_options;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  MessageLite::SerializeAsString_abi_cxx11_(&local_98,*(MessageLite **)(field + 0x38));
  OptionsValue(&local_58,this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = std::operator!=(&local_58,"None");
  if (!bVar1) goto LAB_002c5dfd;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if (((byte)field[1] & 8) == 0) {
    pDVar2 = *(Descriptor **)(field + 0x20);
    std::__cxx11::string::string((string *)&local_78,"fields_by_name",&local_99);
    FieldReferencingExpression(&local_38,this,pDVar2,field,&local_78);
LAB_002c5dbc:
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    pDVar2 = FieldDescriptor::extension_scope(field);
    if (pDVar2 != (Descriptor *)0x0) {
      pDVar2 = FieldDescriptor::extension_scope(field);
      std::__cxx11::string::string((string *)&local_78,"extensions_by_name",&local_99);
      FieldReferencingExpression(&local_38,this,pDVar2,field,&local_78);
      goto LAB_002c5dbc;
    }
    std::__cxx11::string::_M_assign((string *)&local_98);
  }
  anon_unknown_0::PrintDescriptorOptionsFixingCode(&local_98,&local_58,this->printer_);
  std::__cxx11::string::~string((string *)&local_98);
LAB_002c5dfd:
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Generator::FixOptionsForField(const FieldDescriptor& field) const {
  std::string field_options = OptionsValue(field.options().SerializeAsString());
  if (field_options != "None") {
    std::string field_name;
    if (field.is_extension()) {
      if (field.extension_scope() == nullptr) {
        // Top level extensions.
        field_name = field.name();
      } else {
        field_name = FieldReferencingExpression(field.extension_scope(), field,
                                                "extensions_by_name");
      }
    } else {
      field_name = FieldReferencingExpression(field.containing_type(), field,
                                              "fields_by_name");
    }
    PrintDescriptorOptionsFixingCode(field_name, field_options, printer_);
  }
}